

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitAtomicWait(BinaryInstWriter *this,AtomicWait *curr)

{
  BasicType BVar1;
  uint64_t offset;
  size_t sVar2;
  char *pcVar3;
  Name memory;
  size_t sStack_20;
  
  BufferWithRandomAccess::operator<<(this->o,-2);
  BVar1 = wasm::Type::getBasic(&curr->expectedType);
  if (BVar1 == i64) {
    BufferWithRandomAccess::operator<<(this->o,'\x02');
    offset = (curr->offset).addr;
    sVar2 = (curr->memory).super_IString.str._M_len;
    pcVar3 = (curr->memory).super_IString.str._M_str;
    sStack_20 = 8;
  }
  else {
    if (BVar1 != i32) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0x22e);
    }
    BufferWithRandomAccess::operator<<(this->o,'\x01');
    offset = (curr->offset).addr;
    sVar2 = (curr->memory).super_IString.str._M_len;
    pcVar3 = (curr->memory).super_IString.str._M_str;
    sStack_20 = 4;
  }
  memory.super_IString.str._M_str = pcVar3;
  memory.super_IString.str._M_len = sVar2;
  emitMemoryAccess(this,sStack_20,sStack_20,offset,memory);
  return;
}

Assistant:

void BinaryInstWriter::visitAtomicWait(AtomicWait* curr) {
  o << int8_t(BinaryConsts::AtomicPrefix);
  switch (curr->expectedType.getBasic()) {
    case Type::i32: {
      o << int8_t(BinaryConsts::I32AtomicWait);
      emitMemoryAccess(4, 4, curr->offset, curr->memory);
      break;
    }
    case Type::i64: {
      o << int8_t(BinaryConsts::I64AtomicWait);
      emitMemoryAccess(8, 8, curr->offset, curr->memory);
      break;
    }
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}